

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

void __thiscall cmCTestBuildCommand::BindArguments(cmCTestBuildCommand *this)

{
  static_string_view sVar1;
  cmCTestBuildCommand *this_local;
  
  cmCTestHandlerCommand::BindArguments(&this->super_cmCTestHandlerCommand);
  sVar1 = ::cm::operator____s("NUMBER_ERRORS",0xd);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->NumberErrors);
  sVar1 = ::cm::operator____s("NUMBER_WARNINGS",0xf);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->NumberWarnings);
  sVar1 = ::cm::operator____s("TARGET",6);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Target);
  sVar1 = ::cm::operator____s("CONFIGURATION",0xd);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->Configuration);
  sVar1 = ::cm::operator____s("FLAGS",5);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,&this->Flags);
  sVar1 = ::cm::operator____s("PROJECT_NAME",0xc);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ProjectName);
  sVar1 = ::cm::operator____s("PARALLEL_LEVEL",0xe);
  cmArgumentParser<void>::Bind<std::__cxx11::string>
            (&(this->super_cmCTestHandlerCommand).super_cmArgumentParser<void>,sVar1,
             &this->ParallelLevel);
  return;
}

Assistant:

void cmCTestBuildCommand::BindArguments()
{
  this->cmCTestHandlerCommand::BindArguments();
  this->Bind("NUMBER_ERRORS"_s, this->NumberErrors);
  this->Bind("NUMBER_WARNINGS"_s, this->NumberWarnings);
  this->Bind("TARGET"_s, this->Target);
  this->Bind("CONFIGURATION"_s, this->Configuration);
  this->Bind("FLAGS"_s, this->Flags);
  this->Bind("PROJECT_NAME"_s, this->ProjectName);
  this->Bind("PARALLEL_LEVEL"_s, this->ParallelLevel);
}